

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3VdbeSerialTypeLen(u32 serial_type)

{
  uint local_c;
  u32 serial_type_local;
  
  if (serial_type < 0x80) {
    local_c = (uint)""[serial_type];
  }
  else {
    local_c = serial_type - 0xc >> 1;
  }
  return local_c;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3VdbeSerialTypeLen(u32 serial_type){
  if( serial_type>=128 ){
    return (serial_type-12)/2;
  }else{
    assert( serial_type<12
            || sqlite3SmallTypeSizes[serial_type]==(serial_type - 12)/2 );
    return sqlite3SmallTypeSizes[serial_type];
  }
}